

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O1

unsigned_long ixmlNamedNodeMap_getLength(IXML_NamedNodeMap *nnMap)

{
  unsigned_long uVar1;
  IXML_Node *pIVar2;
  
  if ((nnMap != (IXML_NamedNodeMap *)0x0) && (pIVar2 = nnMap->nodeItem, pIVar2 != (IXML_Node *)0x0))
  {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
      pIVar2 = pIVar2->nextSibling;
    } while (pIVar2 != (Nodeptr)0x0);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned long ixmlNamedNodeMap_getLength(IXML_NamedNodeMap *nnMap)
{
	IXML_Node *tempNode;
	unsigned long length = 0lu;

	if (nnMap != NULL) {
		tempNode = nnMap->nodeItem;
		for (length = 0lu; tempNode != NULL; ++length) {
			tempNode = tempNode->nextSibling;
		}
	}

	return length;
}